

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateObjectAPITableExtension
          (SwiftGenerator *this,StructDef *struct_def)

{
  Value *type_00;
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  int iVar4;
  FieldDef *field_def;
  StructDef *struct_def_00;
  pointer pcVar5;
  SwiftGenerator *pSVar6;
  IdlNamer *pIVar7;
  size_t sVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  size_type *psVar12;
  pointer ppFVar13;
  char *__s;
  pointer pbVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  string code;
  string builder;
  string field_var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unpack_body;
  string body;
  string field_field;
  string check_if_vector;
  string type;
  string field_method;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  long *local_270 [2];
  long local_260 [2];
  SwiftGenerator *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  CodeWriter *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  long *local_108 [2];
  long local_f8 [2];
  StructDef *local_e8;
  IdlNamer *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  IdlNamer::NamespacedObjectType_abi_cxx11_(&local_50,&this->namer_,&struct_def->super_Definition);
  GenerateObjectAPIExtensionHeader(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_270[0] = local_260;
  local_250 = this;
  local_e0 = &this->namer_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,", &builder)","");
  ppFVar13 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar13 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_290.field_2;
    local_1f0 = &local_250->code_;
    local_e8 = struct_def;
    do {
      pIVar7 = local_e0;
      field_def = *ppFVar13;
      if (field_def->deprecated == false) {
        local_d8 = ppFVar13;
        (*(local_e0->super_Namer)._vptr_Namer[7])(&local_248,local_e0,field_def);
        (*(pIVar7->super_Namer)._vptr_Namer[0x12])(&local_1e8,pIVar7,field_def);
        (*(pIVar7->super_Namer)._vptr_Namer[4])(local_108,pIVar7,field_def);
        type_00 = &field_def->value;
        GenType_abi_cxx11_(&local_128,local_250,&type_00->type,false);
        BVar3 = (type_00->type).base_type;
        __s = "VectorOf(";
        if (((BVar3 != BASE_TYPE_VECTOR) && (__s = "VectorOf(", BVar3 != BASE_TYPE_VECTOR64)) &&
           (__s = "VectorOf(", BVar3 != BASE_TYPE_ARRAY)) {
          __s = "(";
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        sVar8 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,__s,__s + sVar8);
        std::operator+(&local_2d0,"add",&local_148);
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_108[0]);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        puVar11 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_2f0.field_2._M_allocated_capacity = *puVar11;
          local_2f0.field_2._8_8_ = plVar9[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar11;
          local_2f0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_2f0._M_string_length = plVar9[1];
        *plVar9 = (long)puVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_210.field_2._M_allocated_capacity = *psVar12;
          local_210.field_2._8_8_ = plVar9[3];
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar12;
          local_210._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_210._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        BVar3 = (type_00->type).base_type;
        if (BVar3 - BASE_TYPE_STRING < 5) {
          paVar2 = &local_2b0.field_2;
          switch(BVar3) {
          case BASE_TYPE_STRING:
            std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0.field_2._8_8_ = puVar10[3];
              local_2b0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2b0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2d0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0])
            ;
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2f0._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar1) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if (field_def->presence != kRequired) {
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,"builder.create(string: s)","");
              BuildingOptionalObjects(local_250,&local_1e8,&local_2f0);
              break;
            }
            std::operator+(&local_2b0,"let __",&local_248);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2d0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2d0,(ulong)local_1e8._M_dataplus._M_p);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2f0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1a8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            CodeWriter::operator+=(local_1f0,&local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar15 = local_2b0.field_2._M_allocated_capacity;
            _Var16._M_p = local_2b0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p == paVar2) goto LAB_002e5175;
            goto LAB_002e516d;
          default:
            GenerateVectorObjectAPITableExtension(local_250,field_def);
            std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_290);
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0.field_2._8_8_ = plVar9[3];
              local_2b0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2b0._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2d0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2f0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2f0);
LAB_002e510f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar15 = local_290.field_2._M_allocated_capacity;
            _Var16._M_p = local_290._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar1) goto LAB_002e516d;
            goto LAB_002e5175;
          case BASE_TYPE_STRUCT:
            struct_def_00 = (field_def->value).type.struct_def;
            if ((struct_def_00 == (StructDef *)0x0) || (struct_def_00->fixed != true)) {
              std::operator+(&local_1c8,"let __",&local_248);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
              puVar11 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_290.field_2._M_allocated_capacity = *puVar11;
                local_290.field_2._8_8_ = puVar10[3];
                local_290._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_290.field_2._M_allocated_capacity = *puVar11;
                local_290._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_290._M_string_length = puVar10[1];
              *puVar10 = puVar11;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_290,(ulong)local_128._M_dataplus._M_p);
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_2b0.field_2._M_allocated_capacity = *psVar12;
                local_2b0.field_2._8_8_ = plVar9[3];
                local_2b0._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_2b0.field_2._M_allocated_capacity = *psVar12;
                local_2b0._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_2b0._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b0);
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_2d0.field_2._M_allocated_capacity = *psVar12;
                local_2d0.field_2._8_8_ = plVar9[3];
              }
              else {
                local_2d0.field_2._M_allocated_capacity = *psVar12;
                local_2d0._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_2d0._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_2d0,(ulong)local_1e8._M_dataplus._M_p);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_2f0.field_2._M_allocated_capacity = *psVar12;
                local_2f0.field_2._8_8_ = plVar9[3];
              }
              else {
                local_2f0.field_2._M_allocated_capacity = *psVar12;
                local_2f0._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_2f0._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_188.field_2._M_allocated_capacity = *psVar12;
                local_188.field_2._8_8_ = plVar9[3];
              }
              else {
                local_188.field_2._M_allocated_capacity = *psVar12;
                local_188._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_188._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              CodeWriter::operator+=(local_1f0,&local_188);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != paVar2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != paVar1) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
              puVar11 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_2b0.field_2._M_allocated_capacity = *puVar11;
                local_2b0.field_2._8_8_ = puVar10[3];
                local_2b0._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_2b0.field_2._M_allocated_capacity = *puVar11;
                local_2b0._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_2b0._M_string_length = puVar10[1];
              *puVar10 = puVar11;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              psVar12 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_2d0.field_2._M_allocated_capacity = *psVar12;
                local_2d0.field_2._8_8_ = puVar10[3];
              }
              else {
                local_2d0.field_2._M_allocated_capacity = *psVar12;
                local_2d0._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_2d0._M_string_length = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              puVar11 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_2f0.field_2._M_allocated_capacity = *puVar11;
                local_2f0.field_2._8_8_ = puVar10[3];
              }
              else {
                local_2f0.field_2._M_allocated_capacity = *puVar11;
                local_2f0._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_2f0._M_string_length = puVar10[1];
              *puVar10 = puVar11;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_228,&local_2f0);
              goto LAB_002e510f;
            }
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            local_2f0._M_string_length = 0;
            local_2f0.field_2._M_allocated_capacity =
                 local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
            local_2b0._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"","");
            local_290._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"$0","");
            GenerateStructArgs(local_250,struct_def_00,&local_2f0,&local_2d0,&local_2b0,&local_290,
                               true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar1) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_2f0);
            std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_1c8,"{{STRUCTNAME}}.",&local_210);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_290.field_2._M_allocated_capacity = *puVar11;
              local_290.field_2._8_8_ = puVar10[3];
              local_290._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar11;
              local_290._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_290._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_290,(ulong)local_1e8._M_dataplus._M_p);
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0.field_2._8_8_ = puVar10[3];
              local_2b0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2b0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_270[0]);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2d0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar1) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          case BASE_TYPE_UNION:
            std::operator+(&local_2b0,"let __",&local_248);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b0);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2d0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_2d0,(ulong)local_248._M_dataplus._M_p);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2f0.field_2._M_allocated_capacity = *psVar12;
              local_2f0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *psVar12;
              local_2f0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2f0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_168.field_2._M_allocated_capacity = *psVar12;
              local_168.field_2._8_8_ = plVar9[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *psVar12;
              local_168._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_168._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            CodeWriter::operator+=(local_1f0,&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_2d0,"if let o = obj.",&local_248);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2f0.field_2._M_allocated_capacity = *psVar12;
              local_2f0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *psVar12;
              local_2f0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2f0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_2b0,"  {{STRUCTNAME}}.add(",&local_248);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b0);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2d0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0])
            ;
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2f0.field_2._M_allocated_capacity = *psVar12;
              local_2f0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *psVar12;
              local_2f0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2f0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_290,"  {{STRUCTNAME}}.",&local_210);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0.field_2._8_8_ = puVar10[3];
              local_2b0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *puVar11;
              local_2b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2b0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar12;
              local_2d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2d0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0])
            ;
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *puVar11;
              local_2f0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2f0._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar1) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"}\n","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,&local_2f0);
          }
          uVar15 = local_2f0.field_2._M_allocated_capacity;
          _Var16._M_p = local_2f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
LAB_002e516d:
            operator_delete(_Var16._M_p,uVar15 + 1);
          }
        }
        else if (BVar3 != BASE_TYPE_UTYPE) {
          std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          puVar11 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_2b0.field_2._M_allocated_capacity = *puVar11;
            local_2b0.field_2._8_8_ = puVar10[3];
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *puVar11;
            local_2b0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2b0._M_string_length = puVar10[1];
          *puVar10 = puVar11;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2b0,(ulong)local_1e8._M_dataplus._M_p);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2d0.field_2._M_allocated_capacity = *psVar12;
            local_2d0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar12;
            local_2d0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2d0._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          puVar11 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_2f0.field_2._M_allocated_capacity = *puVar11;
            local_2f0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2f0.field_2._M_allocated_capacity = *puVar11;
            local_2f0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2f0._M_string_length = puVar10[1];
          *puVar10 = puVar11;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228
                     ,&local_2f0);
          goto LAB_002e510f;
        }
LAB_002e5175:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        struct_def = local_e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0],local_f8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        ppFVar13 = local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          ppFVar13 = local_d8;
        }
      }
      ppFVar13 = ppFVar13 + 1;
    } while (ppFVar13 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)",
             "");
  pSVar6 = local_250;
  this_00 = &local_250->code_;
  CodeWriter::operator+=(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start <
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar14 = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar5 = (pbVar14->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar5,pcVar5 + pbVar14->_M_string_length);
      CodeWriter::operator+=(this_00,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 < local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: __root)","");
  CodeWriter::operator+=(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (pSVar6->code_).cur_ident_lvl_;
  if (iVar4 != 0) {
    (pSVar6->code_).cur_ident_lvl_ = iVar4 + -1;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"}","");
  CodeWriter::operator+=(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

void GenerateObjectAPITableExtension(const StructDef &struct_def) {
    GenerateObjectAPIExtensionHeader(namer_.NamespacedObjectType(struct_def));
    std::vector<std::string> unpack_body;
    std::string builder = ", &builder)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto field_var = namer_.Variable(field);
      const auto field_field = namer_.Field(field);
      const auto field_method = namer_.Method(field);
      const auto type = GenType(field.value.type);
      std::string check_if_vector =
          (IsVector(field.value.type) || IsArray(field.value.type))
              ? "VectorOf("
              : "(";
      std::string body = "add" + check_if_vector + field_method + ": ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
        case BASE_TYPE_VECTOR: {
          GenerateVectorObjectAPITableExtension(field);
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          break;
        }
        case BASE_TYPE_UNION: {
          code_ += "let __" + field_var + " = obj." + field_var +
                   "?.pack(builder: &builder) ?? Offset()";
          unpack_body.push_back("if let o = obj." + field_var + "?.type {");
          unpack_body.push_back("  {{STRUCTNAME}}.add(" + field_var +
                                "Type: o" + builder);
          unpack_body.push_back("  {{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          unpack_body.push_back("}\n");
          break;
        }
        case BASE_TYPE_STRUCT: {
          if (field.value.type.struct_def &&
              field.value.type.struct_def->fixed) {
            // This is a Struct (IsStruct), not a table. We create
            // a native swift object in this case.
            std::string code;
            GenerateStructArgs(*field.value.type.struct_def, &code, "", "",
                               "$0", true);
            code = code.substr(0, code.size() - 2);
            unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                  field_field + builder);
          } else {
            code_ += "let __" + field_var + " = " + type +
                     ".pack(&builder, obj: &obj." + field_field + ")";
            unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                  builder);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          if (field.IsRequired()) {
            code_ += "let __" + field_var + " = builder.create(string: obj." +
                     field_field + ")";
          } else {
            BuildingOptionalObjects(field_field, "builder.create(string: s)");
          }
          break;
        }
        case BASE_TYPE_UTYPE: break;
        default:
          unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                field_field + builder);
      }
    }
    code_ += "let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)";
    for (auto it = unpack_body.begin(); it < unpack_body.end(); it++)
      code_ += *it;
    code_ +=
        "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: "
        "__root)";
    Outdent();
    code_ += "}";
  }